

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O2

void ImGui::TableBeginInitMemory(ImGuiTable *table,int columns_count)

{
  ImGuiTableColumn *pIVar1;
  void *__s;
  ImGuiTableColumn *pIVar2;
  ImGuiTableCellData *pIVar3;
  uint uVar4;
  size_t size;
  
  uVar4 = columns_count * 0x69 + 3U & 0xfffffffc;
  size = (size_t)(int)(uVar4 + columns_count * 8);
  __s = MemAlloc(size);
  table->RawData = __s;
  memset(__s,0,size);
  pIVar1 = (ImGuiTableColumn *)table->RawData;
  pIVar2 = (ImGuiTableColumn *)((long)&pIVar1->Flags + (long)(columns_count * 0x68));
  (table->Columns).Data = pIVar1;
  (table->Columns).DataEnd = pIVar2;
  (table->DisplayOrderToIndex).Data = (char *)pIVar2;
  (table->DisplayOrderToIndex).DataEnd = (char *)((long)&pIVar2->Flags + (long)columns_count);
  pIVar3 = (ImGuiTableCellData *)((long)&pIVar1->Flags + (long)(int)uVar4);
  (table->RowCellData).Data = pIVar3;
  (table->RowCellData).DataEnd =
       (ImGuiTableCellData *)((long)&pIVar3->BgColor + (long)(columns_count * 8));
  return;
}

Assistant:

void ImGui::TableBeginInitMemory(ImGuiTable* table, int columns_count)
{
    // Allocate single buffer for our arrays
    ImSpanAllocator<3> span_allocator;
    span_allocator.Reserve(0, columns_count * sizeof(ImGuiTableColumn));
    span_allocator.Reserve(1, columns_count * sizeof(ImGuiTableColumnIdx));
    span_allocator.Reserve(2, columns_count * sizeof(ImGuiTableCellData), 4);
    table->RawData = IM_ALLOC(span_allocator.GetArenaSizeInBytes());
    memset(table->RawData, 0, span_allocator.GetArenaSizeInBytes());
    span_allocator.SetArenaBasePtr(table->RawData);
    span_allocator.GetSpan(0, &table->Columns);
    span_allocator.GetSpan(1, &table->DisplayOrderToIndex);
    span_allocator.GetSpan(2, &table->RowCellData);
}